

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Table * isSimpleCount(Select *p,AggInfo *pAggInfo)

{
  SrcList *pSVar1;
  Table *pTVar2;
  Expr *pEVar3;
  Table *pTVar4;
  
  if ((((((p->pWhere == (Expr *)0x0) && (p->pEList->nExpr == 1)) &&
        (pSVar1 = p->pSrc, pSVar1->nSrc == 1)) &&
       (((pSVar1->a[0].fg.field_0x1 & 4) == 0 && (pAggInfo->nFunc == 1)))) &&
      ((p->pHaving == (Expr *)0x0 &&
       ((pTVar2 = pSVar1->a[0].pSTab, pTVar2->eTabType == '\0' &&
        (pEVar3 = p->pEList->a[0].pExpr, pEVar3->op == 0xa9)))))) &&
     ((pEVar3->pAggInfo == pAggInfo && ((pAggInfo->aFunc->pFunc->funcFlags & 0x100) != 0)))) {
    pTVar4 = (Table *)0x0;
    if ((pEVar3->flags & 0x1000004) == 0) {
      pTVar4 = pTVar2;
    }
    return pTVar4;
  }
  return (Table *)0x0;
}

Assistant:

static Table *isSimpleCount(Select *p, AggInfo *pAggInfo){
  Table *pTab;
  Expr *pExpr;

  assert( !p->pGroupBy );

  if( p->pWhere
   || p->pEList->nExpr!=1
   || p->pSrc->nSrc!=1
   || p->pSrc->a[0].fg.isSubquery
   || pAggInfo->nFunc!=1
   || p->pHaving
  ){
    return 0;
  }
  pTab = p->pSrc->a[0].pSTab;
  assert( pTab!=0 );
  assert( !IsView(pTab) );
  if( !IsOrdinaryTable(pTab) ) return 0;
  pExpr = p->pEList->a[0].pExpr;
  assert( pExpr!=0 );
  if( pExpr->op!=TK_AGG_FUNCTION ) return 0;
  if( pExpr->pAggInfo!=pAggInfo ) return 0;
  if( (pAggInfo->aFunc[0].pFunc->funcFlags&SQLITE_FUNC_COUNT)==0 ) return 0;
  assert( pAggInfo->aFunc[0].pFExpr==pExpr );
  testcase( ExprHasProperty(pExpr, EP_Distinct) );
  testcase( ExprHasProperty(pExpr, EP_WinFunc) );
  if( ExprHasProperty(pExpr, EP_Distinct|EP_WinFunc) ) return 0;

  return pTab;
}